

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O2

from_chars_result
absl::lts_20250127::from_chars
          (Nonnull<const_char_*> first,Nonnull<const_char_*> last,float *value,chars_format fmt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  int iVar11;
  uint64_t guess_mantissa;
  byte bVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint128 *calculated;
  ulong uVar17;
  int iVar18;
  Nonnull<const_char_*> begin;
  bool negative;
  float fVar19;
  uint128 other;
  uint128 value_00;
  CalculatedFloat CVar20;
  from_chars_result fVar21;
  from_chars_result result;
  char local_89;
  uint128 wide_binary_mantissa;
  ParsedFloat hex_parse;
  uint128 local_40;
  
  result.ec = 0;
  negative = false;
  begin = first;
  if (first != last) {
    negative = *first == '-';
    begin = first + negative;
  }
  result.ptr = first;
  if (((fmt & hex) == 0) && (1 < (long)last - (long)begin)) {
    if ((*begin == '0') && ((byte)(begin[1] | 0x20U) == 0x78)) {
      strings_internal::ParseFloat<16>(&hex_parse,begin + 2,last,fmt);
      if ((hex_parse.end != (char *)0x0) && (hex_parse.type == kNumber)) goto LAB_0026104f;
      if (fmt != scientific) {
        result.ptr = begin + 1;
        if (negative == false) {
          fVar19 = 0.0;
        }
        else {
          fVar19 = -0.0;
        }
        *value = fVar19;
        goto LAB_00261244;
      }
    }
    else {
LAB_00260fd1:
      strings_internal::ParseFloat<10>(&hex_parse,begin,last,fmt);
      if (hex_parse.end != (char *)0x0) {
        result.ptr = hex_parse.end;
        bVar9 = anon_unknown_0::HandleEdgeCase<float>(&hex_parse,negative,value);
        if (bVar9) goto LAB_00261244;
        if (hex_parse.subrange_begin == (char *)0x0) {
          if (hex_parse.exponent < -0x40) {
            if (negative == false) {
              fVar19 = 0.0;
            }
            else {
              fVar19 = -0.0;
            }
          }
          else {
            if (hex_parse.exponent < 0x27) {
              if (hex_parse.mantissa == 0) {
                uVar16 = 0x40;
              }
              else {
                lVar14 = 0x3f;
                if (hex_parse.mantissa != 0) {
                  for (; hex_parse.mantissa >> lVar14 == 0; lVar14 = lVar14 + -1) {
                  }
                }
                uVar16 = (uint)lVar14 ^ 0x3f;
              }
              uVar15 = hex_parse.mantissa << ((byte)uVar16 & 0x3f);
              uVar17 = (ulong)(hex_parse.exponent + 0x156);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar15;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable +
                                       uVar17 * 8);
              auVar6 = auVar2 * auVar4;
              if (CARRY8(auVar6._0_8_,uVar15) && (~auVar6._8_8_ & 0x3fffffffff) == 0) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar15;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaLowTable +
                                         uVar17 * 8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = SUB168(auVar3 * auVar5,8);
                auVar6 = auVar6 + auVar8;
                if (auVar6._0_8_ == -1 && (~auVar6._8_8_ & 0x3fffffffff) == 0) {
                  if (CARRY8(SUB168(auVar3 * auVar5,0),uVar15)) goto LAB_002610e9;
                  auVar6._8_8_ = auVar6._8_8_;
                  auVar6._0_8_ = 0xffffffffffffffff;
                }
              }
              uVar15 = auVar6._8_8_ >> (0x26U - (auVar6[0xf] >> 7) & 0x3f);
              uVar13 = (uint)uVar15;
              if ((auVar6._0_8_ != 0) ||
                 ((uVar13 & 3) != 1 ||
                  (auVar6 & (undefined1  [16])0x3fffffffff) != (undefined1  [16])0x0)) {
                uVar15 = (uVar13 & 1) + uVar15;
                lVar14 = (((long)(int)(((hex_parse.exponent * 0x3526a >> 0x10) - uVar16) + 0xbf) -
                          (auVar6._8_8_ >> 0x3f ^ 1)) + 1) - (ulong)(uVar15 < 0x2000000);
                if (0xffffffffffffff01 < lVar14 - 0xffU) {
                  uVar13 = (int)lVar14 * 0x800000;
                  uVar16 = (uint)(uVar15 >> 1) & 0x7fffff;
                  fVar19 = (float)(uVar16 + uVar13 + 0x80000000);
                  if (negative == false) {
                    fVar19 = (float)(uVar13 | uVar16);
                  }
                  *value = fVar19;
                  goto LAB_00261244;
                }
              }
              goto LAB_002610e9;
            }
            if (negative == false) {
              fVar19 = 3.4028235e+38;
            }
            else {
              fVar19 = -3.4028235e+38;
            }
          }
          *value = fVar19;
          result.ec = result_out_of_range;
          goto LAB_00261244;
        }
        if (hex_parse.exponent < -0x156) {
          uVar15 = 0xfffe7961;
LAB_002610b6:
          auVar7._8_4_ = 0;
          auVar7._0_8_ = uVar15;
          auVar7 = auVar7 << 0x40;
        }
        else {
          if (0x134 < hex_parse.exponent) {
            uVar15 = 99999;
            goto LAB_002610b6;
          }
          uVar17 = (ulong)(hex_parse.exponent + 0x156);
LAB_002610e9:
          wide_binary_mantissa.lo_ = hex_parse.mantissa;
          wide_binary_mantissa.hi_ = 0;
          other.hi_ = 0;
          other.lo_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable + uVar17 * 8);
          uint128::operator*=(&wide_binary_mantissa,other);
          iVar18 = (hex_parse.exponent * 0x3526a >> 0x10) + -0x3f;
          if (hex_parse.subrange_begin == (char *)0x0) {
            if (0x1b < (uint)hex_parse.exponent) {
              iVar10 = anon_unknown_0::TruncateToBitWidth(0x3f,&wide_binary_mantissa);
              iVar11 = 0x27;
              goto LAB_002611d2;
            }
            lVar14 = 0x3f;
            if (wide_binary_mantissa.hi_ != 0) {
              for (; wide_binary_mantissa.hi_ >> lVar14 == 0; lVar14 = lVar14 + -1) {
              }
            }
            if (wide_binary_mantissa.lo_ == 0) {
              uVar16 = 0x40;
            }
            else {
              lVar1 = 0x3f;
              if (wide_binary_mantissa.lo_ != 0) {
                for (; wide_binary_mantissa.lo_ >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              uVar16 = (uint)lVar1 ^ 0x3f;
            }
            uVar13 = (uint)lVar14 ^ 0x3f;
            if (wide_binary_mantissa.hi_ == 0) {
              uVar13 = uVar16;
            }
            iVar11 = ((uint)(wide_binary_mantissa.hi_ != 0) << 6 | 0x28) - uVar13;
            bVar12 = 1;
          }
          else {
            iVar10 = anon_unknown_0::TruncateToBitWidth(0x3a,&wide_binary_mantissa);
            iVar11 = 0x22;
LAB_002611d2:
            iVar18 = iVar18 + iVar10;
            bVar12 = 0;
          }
          iVar10 = -0x95 - iVar18;
          if (-0x95 - iVar18 < iVar11) {
            iVar10 = iVar11;
          }
          value_00.hi_._0_4_ = iVar10;
          value_00.lo_ = wide_binary_mantissa.hi_;
          value_00.hi_._4_4_ = 0;
          guess_mantissa =
               anon_unknown_0::ShiftRightAndRound
                         ((anon_unknown_0 *)wide_binary_mantissa.lo_,value_00,(uint)bVar12,
                          SUB81(&local_89,0),(Nonnull<bool_*>)hex_parse.mantissa);
          if (local_89 == '\0') {
            bVar9 = anon_unknown_0::MustRoundUp(guess_mantissa,iVar18 + iVar10,&hex_parse);
            guess_mantissa = guess_mantissa + bVar9;
          }
          CVar20 = anon_unknown_0::CalculatedFloatFromRawValues<float>
                             (guess_mantissa,iVar18 + iVar10);
          auVar7 = CVar20._0_12_;
        }
        calculated = &local_40;
        goto LAB_0026122f;
      }
    }
LAB_0026107f:
    result.ec = invalid_argument;
  }
  else {
    if ((fmt & hex) == 0) goto LAB_00260fd1;
    strings_internal::ParseFloat<16>(&hex_parse,begin,last,fmt);
    if (hex_parse.end == (char *)0x0) goto LAB_0026107f;
LAB_0026104f:
    result.ptr = hex_parse.end;
    bVar9 = anon_unknown_0::HandleEdgeCase<float>(&hex_parse,negative,value);
    if (bVar9) goto LAB_00261244;
    CVar20 = anon_unknown_0::CalculateFromParsedHexadecimal<float>(&hex_parse);
    auVar7 = CVar20._0_12_;
    calculated = &wide_binary_mantissa;
LAB_0026122f:
    calculated->lo_ = auVar7._0_8_;
    *(int *)&calculated->hi_ = auVar7._8_4_;
    anon_unknown_0::EncodeResult<float>((CalculatedFloat *)calculated,negative,&result,value);
  }
LAB_00261244:
  fVar21.ec = result.ec;
  fVar21.ptr = result.ptr;
  fVar21._12_4_ = 0;
  return fVar21;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, float& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}